

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_mismatch.cpp
# Opt level: O2

void __thiscall
cpp_db::type_mismatch::type_mismatch(type_mismatch *this,type_index *src_type,type_index *dest_type)

{
  allocator<char> local_e2;
  allocator<char> local_e1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"Value type \'",&local_e1);
  std::operator+(&local_c0,&local_40,
                 *(char **)(dest_type->_M_target + 8) +
                 (**(char **)(dest_type->_M_target + 8) == '*'));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e0,"\' is not convertible to \'",&local_e2);
  std::operator+(&local_a0,&local_c0,&local_e0);
  std::operator+(&local_80,&local_a0,
                 *(char **)(src_type->_M_target + 8) + (**(char **)(src_type->_M_target + 8) == '*')
                );
  std::operator+(&local_60,&local_80,"\'");
  std::runtime_error::runtime_error(&this->super_runtime_error,(string *)&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_40);
  *(undefined ***)this = &PTR__runtime_error_0018ecd8;
  return;
}

Assistant:

type_mismatch::type_mismatch(const std::type_index &src_type, const std::type_index &dest_type)
    : std::runtime_error(std::string("Value type '")
                            +dest_type.name()
                            + std::string("' is not convertible to '")
                            + src_type.name()+"'"
                         )
{
}